

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunnonlinsol_newton.c
# Opt level: O1

int LSetup(int jbad,int *jcur,void *mem)

{
  double dVar1;
  long *plVar2;
  double *pdVar3;
  long *plVar4;
  double *pdVar5;
  double *pdVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  
  if (mem != (void *)0x0) {
    plVar2 = *(long **)((long)mem + 0x28);
    pdVar3 = *(double **)(**(long **)((long)mem + 8) + 0x10);
    dVar1 = *pdVar3;
    dVar8 = pdVar3[1];
    dVar9 = pdVar3[2];
    plVar4 = *(long **)(*plVar2 + 0x20);
    pdVar3 = (double *)*plVar4;
    *pdVar3 = dVar1 + dVar1;
    dVar8 = dVar8 + dVar8;
    pdVar5 = (double *)plVar4[1];
    *pdVar5 = dVar8;
    dVar9 = dVar9 + dVar9;
    pdVar6 = (double *)plVar4[2];
    *pdVar6 = dVar9;
    pdVar3[1] = dVar1 * 4.0;
    pdVar5[1] = dVar8;
    pdVar6[1] = -4.0;
    pdVar3[2] = dVar1 * 6.0;
    pdVar5[2] = -4.0;
    pdVar6[2] = dVar9;
    *jcur = 1;
    iVar7 = SUNLinSolSetup(*(undefined8 *)((long)mem + 0x30),plVar2);
    return iVar7;
  }
  printf("ERROR: Integrator memory is NULL");
  return -1;
}

Assistant:

int LSetup(sunbooleantype jbad, sunbooleantype* jcur, void* mem)
{
  int retval;
  IntegratorMem Imem;

  if (mem == NULL)
  {
    printf("ERROR: Integrator memory is NULL");
    return (-1);
  }
  Imem = (IntegratorMem)mem;

  /* compute the Jacobian */
  retval = Jac(ZERO, Imem->ycur, NULL, Imem->A, NULL, NULL, NULL, NULL);
  if (retval != 0) { return (retval); }

  /* update Jacobian status */
  *jcur = SUNTRUE;

  /* setup the linear solver */
  retval = SUNLinSolSetup(Imem->LS, Imem->A);

  return (retval);
}